

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_Select_Test::TestBody(Image_Select_Test *this)

{
  Point2i p;
  bool bVar1;
  memory_resource *pmVar2;
  Allocator AVar3;
  int x;
  _Alloc_hider _Var4;
  long lVar5;
  long *plVar6;
  long lVar7;
  char *pcVar8;
  char *in_R9;
  Tuple2<pbrt::Point2,_int> expected_predicate_value;
  long lVar9;
  Float FVar10;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_7;
  ImageChannelDesc rgDesc;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> pix;
  Image rgImage;
  ImageChannelDesc aDesc;
  Image aImage;
  Image image;
  Tuple2<pbrt::Point2,_int> local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  Tuple2<pbrt::Point2,_int> local_438;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  ImageChannelDesc local_428;
  long local_3f8;
  int local_3ec;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_3e8;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  local_3a8;
  int local_320;
  polymorphic_allocator<unsigned_char> local_310;
  uchar *local_308;
  size_t local_300;
  size_t local_2f8;
  polymorphic_allocator<pbrt::Half> local_2f0;
  Half *local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  polymorphic_allocator<float> local_2d0;
  float *local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  ImageChannelDesc local_2b0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_280;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [48];
  undefined1 local_210 [16];
  string local_200 [16];
  long local_1f0 [7];
  undefined4 local_1b8;
  polymorphic_allocator<unsigned_char> local_1a8;
  uchar *local_1a0;
  size_t local_198;
  size_t local_190;
  polymorphic_allocator<pbrt::Half> local_188;
  Half *local_180;
  size_t local_178;
  size_t local_170;
  polymorphic_allocator<float> local_168;
  float *local_160;
  size_t local_158;
  size_t local_150;
  Image local_148;
  
  GetFloatPixels(&local_3e8,(Point2i)0x900000004,4);
  pmVar2 = pstd::pmr::new_delete_resource();
  local_3c8._0_4_ = SUB84(pmVar2,0);
  local_3c8._4_4_ = (undefined4)((ulong)pmVar2 >> 0x20);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_280,&local_3e8,(polymorphic_allocator<float> *)local_3c8);
  local_260._0_8_ = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"A","");
  local_240._0_8_ = local_240 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"B","");
  local_240._32_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_240 + 0x20),"G","");
  _Var4._M_p = (pointer)local_1f0;
  local_200._0_8_ = _Var4._M_p;
  std::__cxx11::string::_M_construct<char_const*>(local_200,"R","");
  channels.n = 4;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  pbrt::Image::Image(&local_148,&local_280,(Point2i)0x900000004,channels);
  lVar9 = -0x80;
  do {
    if ((long *)_Var4._M_p != *(long **)((long)_Var4._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var4._M_p + -0x10),*(long *)_Var4._M_p + 1);
    }
    _Var4._M_p = _Var4._M_p + -0x20;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_280.nStored = 0;
  (*(local_280.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_280.alloc.memoryResource,local_280.ptr,local_280.nAlloc << 2,4);
  local_260._0_8_ = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"A","");
  requestedChannels.n = 1;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  pbrt::Image::GetChannelDesc(&local_2b0,&local_148,requestedChannels);
  if ((undefined1 *)local_260._0_8_ != local_250) {
    operator_delete((void *)local_260._0_8_,local_250._0_8_ + 1);
  }
  local_3c8[0] = (internal)(local_2b0.offset.nStored != 0);
  local_3c8._8_4_ = 0;
  local_3c8._12_4_ = 0;
  if (local_2b0.offset.nStored == 0) {
    testing::Message::Message((Message *)&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_260,(internal *)local_3c8,(AssertionResult *)"bool(aDesc)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x250,(char *)local_260._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_450,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_450);
    if ((undefined1 *)local_260._0_8_ != local_250) {
      operator_delete((void *)local_260._0_8_,local_250._0_8_ + 1);
    }
    if (local_428.offset.alloc.memoryResource != (memory_resource *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_428.offset.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_428.offset.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Image::SelectChannels((Image *)local_260,&local_148,&local_2b0,AVar3);
  local_428.offset.alloc.memoryResource =
       (memory_resource *)CONCAT44(local_260._8_4_,local_260._4_4_);
  local_450.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_148.resolution.super_Tuple2<pbrt::Point2,_int>;
  expected_predicate_value = local_148.resolution.super_Tuple2<pbrt::Point2,_int>;
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)local_3c8,"aImage.Resolution()","image.Resolution()",
             (Point2<int> *)&local_428,(Point2<int> *)&local_450);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_428);
    if ((undefined8 *)CONCAT44(local_3c8._12_4_,local_3c8._8_4_) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(local_3c8._12_4_,local_3c8._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x253,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_450,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_450);
    if (local_428.offset.alloc.memoryResource != (memory_resource *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_428.offset.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_428.offset.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_428.offset.alloc.memoryResource._0_4_ = 1.4013e-45;
  local_450.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_450.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,local_1b8);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3c8,"1","aImage.NChannels()",(int *)&local_428,(int *)&local_450);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_428);
    if ((undefined8 *)CONCAT44(local_3c8._12_4_,local_3c8._8_4_) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(local_3c8._12_4_,local_3c8._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x254,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_450,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_450);
    if (local_428.offset.alloc.memoryResource != (memory_resource *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_428.offset.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_428.offset.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_438.x = 1;
  pbrt::Image::ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3c8,(Image *)local_260);
  local_450.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(CONCAT44(local_3c8._12_4_,local_3c8._8_4_) -
                 CONCAT44(local_3c8._4_4_,local_3c8._0_4_) >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_428,"1","aImage.ChannelNames().size()",&local_438.x,
             (unsigned_long *)&local_450);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  if (local_428.offset.alloc.memoryResource._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_3c8);
    if (local_428.offset.ptr == (int *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_428.offset.ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x255,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_450,(Message *)local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_450);
    if (CONCAT44(local_3c8._4_4_,local_3c8._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_428.offset.ptr,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pbrt::Image::ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3c8,(Image *)local_260);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_428,"\"A\"","aImage.ChannelNames()[0]",(char (*) [2])0xad3c3a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_3c8._4_4_,local_3c8._0_4_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  if (local_428.offset.alloc.memoryResource._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_3c8);
    if (local_428.offset.ptr == (int *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_428.offset.ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x256,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_450,(Message *)local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_450);
    if (CONCAT44(local_3c8._4_4_,local_3c8._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_428.offset.ptr,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar7 = 0;
  lVar9 = 0;
  do {
    lVar5 = 0;
    local_3f8 = lVar9;
    do {
      FVar10 = pbrt::Image::GetChannel
                         ((Image *)local_260,(Point2i)(lVar7 + lVar5),0,(WrapMode2D)0x200000002);
      local_428.offset.alloc.memoryResource._0_4_ = FVar10;
      FVar10 = pbrt::Image::GetChannel
                         (&local_148,(Point2i)(lVar7 + lVar5),0,(WrapMode2D)0x200000002);
      local_450.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_450.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,FVar10);
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)local_3c8,"aImage.GetChannel({x, y}, 0)","image.GetChannel({x, y}, 0)",
                 (float *)&local_428,(float *)&local_450);
      if (local_3c8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_428);
        pcVar8 = "";
        if ((undefined8 *)CONCAT44(local_3c8._12_4_,local_3c8._8_4_) != (undefined8 *)0x0) {
          pcVar8 = *(char **)CONCAT44(local_3c8._12_4_,local_3c8._8_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_450,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x259,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_450,(Message *)&local_428)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_450);
        if (local_428.offset.alloc.memoryResource != (memory_resource *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_428.offset.alloc.memoryResource != (memory_resource *)0x0)) {
            (*(local_428.offset.alloc.memoryResource)->_vptr_memory_resource[1])();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_3c8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar7 = lVar7 + 0x100000000;
    lVar9 = local_3f8 + 1;
  } while (lVar9 != 9);
  local_3c8._0_8_ =
       (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"R","");
  plVar6 = (long *)((long)(((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_3b8)->field_2).fixed + 0x10);
  local_3a8.fixed[0]._M_dataplus._M_p = (_Alloc_hider)plVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3b8)->field_2,"G","");
  requestedChannels_00.n = 2;
  requestedChannels_00.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8;
  pbrt::Image::GetChannelDesc(&local_428,&local_148,requestedChannels_00);
  lVar9 = -0x40;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_450.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_450.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_428.offset.nStored != 0);
  local_450.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_428.offset.nStored == 0) {
    testing::Message::Message((Message *)&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3c8,(internal *)&local_450,(AssertionResult *)"bool(rgDesc)","false",
               "true",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x25c,(char *)local_3c8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_3c8._0_8_ !=
        (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_3b8) {
      operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._0_8_ + 1));
    }
    if (local_438 != (Tuple2<pbrt::Point2,_int>)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_438 != (Tuple2<pbrt::Point2,_int>)0x0)) {
        (**(code **)(*(long *)local_438 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_450.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Image::SelectChannels((Image *)local_3c8,&local_148,&local_428,AVar3);
  local_438.y = local_3c8._8_4_;
  local_438.x = local_3c8._4_4_;
  local_458 = local_148.resolution.super_Tuple2<pbrt::Point2,_int>;
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)&local_450,"rgImage.Resolution()","image.Resolution()",
             (Point2<int> *)&local_438,(Point2<int> *)&local_458);
  if (local_450.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_438);
    if (local_450.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_450.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x25e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
    if (local_438 != (Tuple2<pbrt::Point2,_int>)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_438 != (Tuple2<pbrt::Point2,_int>)0x0)) {
        (**(code **)(*(long *)local_438 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_450.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_438.x = 2;
  local_458.x = local_320;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_450,"2","rgImage.NChannels()",&local_438.x,&local_458.x);
  if (local_450.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_438);
    if (local_450.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_450.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x25f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
    if (local_438 != (Tuple2<pbrt::Point2,_int>)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_438 != (Tuple2<pbrt::Point2,_int>)0x0)) {
        (**(code **)(*(long *)local_438 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_450.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3ec = 2;
  pbrt::Image::ChannelNames_abi_cxx11_(&local_450,(Image *)local_3c8);
  local_458 = (Tuple2<pbrt::Point2,_int>)
              ((long)local_450.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_450.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_438,"2","rgImage.ChannelNames().size()",&local_3ec,
             (unsigned_long *)&local_458);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_450);
  if ((char)local_438.x == '\0') {
    testing::Message::Message((Message *)&local_450);
    if (local_430.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_430.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x260,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
    if (local_450.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_450.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((local_450.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pbrt::Image::ChannelNames_abi_cxx11_(&local_450,(Image *)local_3c8);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_438,"\"R\"","rgImage.ChannelNames()[0]",(char (*) [2])0x618f04,
             local_450.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_450);
  if ((char)local_438.x == '\0') {
    testing::Message::Message((Message *)&local_450);
    if (local_430.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_430.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x261,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
    if (local_450.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_450.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((local_450.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pbrt::Image::ChannelNames_abi_cxx11_(&local_450,(Image *)local_3c8);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_438,"\"G\"","rgImage.ChannelNames()[1]",(char (*) [2])0x618f17,
             local_450.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_450);
  if ((char)local_438.x == '\0') {
    testing::Message::Message((Message *)&local_450);
    if (local_430.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_430.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x262,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
    if (local_450.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_450.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((local_450.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar7 = 0;
  lVar9 = 0;
  do {
    lVar5 = 0;
    local_3f8 = lVar9;
    do {
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar7 + lVar5);
      FVar10 = pbrt::Image::GetChannel((Image *)local_3c8,p,0,(WrapMode2D)0x200000002);
      local_438.x = (int)FVar10;
      FVar10 = pbrt::Image::GetChannel(&local_148,p,3,(WrapMode2D)0x200000002);
      local_458.x = (int)FVar10;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&local_450,"rgImage.GetChannel({x, y}, 0)",
                 "image.GetChannel({x, y}, 3)",(float *)&local_438,(float *)&local_458);
      if (local_450.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_438);
        pcVar8 = "";
        if (local_450.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          pcVar8 = ((local_450.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_458,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x265,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&local_438)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
        if (local_438 != (Tuple2<pbrt::Point2,_int>)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_438 != (Tuple2<pbrt::Point2,_int>)0x0)) {
            (**(code **)(*(long *)local_438 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_450.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      FVar10 = pbrt::Image::GetChannel((Image *)local_3c8,p,1,(WrapMode2D)0x200000002);
      local_438.x = (int)FVar10;
      FVar10 = pbrt::Image::GetChannel(&local_148,p,2,(WrapMode2D)0x200000002);
      local_458.x = (int)FVar10;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&local_450,"rgImage.GetChannel({x, y}, 1)",
                 "image.GetChannel({x, y}, 2)",(float *)&local_438,(float *)&local_458);
      if (local_450.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_438);
        pcVar8 = "";
        if (local_450.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          pcVar8 = ((local_450.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_458,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x266,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_458,(Message *)&local_438)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
        if (local_438 != (Tuple2<pbrt::Point2,_int>)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_438 != (Tuple2<pbrt::Point2,_int>)0x0)) {
            (**(code **)(*(long *)local_438 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_450.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar7 = lVar7 + 0x100000000;
    lVar9 = local_3f8 + 1;
  } while (lVar9 != 9);
  local_2b8 = 0;
  (*(local_2d0.memoryResource)->_vptr_memory_resource[3])
            (local_2d0.memoryResource,local_2c8,local_2c0 << 2,4);
  local_2d8 = 0;
  (*(local_2f0.memoryResource)->_vptr_memory_resource[3])
            (local_2f0.memoryResource,local_2e8,local_2e0 * 2,2);
  local_2f8 = 0;
  (*(local_310.memoryResource)->_vptr_memory_resource[3])
            (local_310.memoryResource,local_308,local_300,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3b8);
  local_428.offset.nStored = 0;
  (*(local_428.offset.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_428.offset.alloc.memoryResource,local_428.offset.ptr,local_428.offset.nAlloc << 2
             ,4);
  local_150 = 0;
  (*(local_168.memoryResource)->_vptr_memory_resource[3])
            (local_168.memoryResource,local_160,local_158 << 2,4);
  local_170 = 0;
  (*(local_188.memoryResource)->_vptr_memory_resource[3])
            (local_188.memoryResource,local_180,local_178 * 2,2);
  local_190 = 0;
  (*(local_1a8.memoryResource)->_vptr_memory_resource[3])
            (local_1a8.memoryResource,local_1a0,local_198,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_250);
  local_2b0.offset.nStored = 0;
  (*(local_2b0.offset.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_2b0.offset.alloc.memoryResource,local_2b0.offset.ptr,local_2b0.offset.nAlloc << 2
             ,4);
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  local_3e8.nStored = 0;
  (*(local_3e8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_3e8.alloc.memoryResource,local_3e8.ptr,local_3e8.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Image, Select) {
    Point2i res(4, 9);
    pstd::vector<float> pix = GetFloatPixels(res, 4);
    Image image(pix, res, {"A", "B", "G", "R"});

    auto aDesc = image.GetChannelDesc({"A"});
    EXPECT_TRUE(bool(aDesc));
    Image aImage = image.SelectChannels(aDesc);

    EXPECT_EQ(aImage.Resolution(), image.Resolution());
    EXPECT_EQ(1, aImage.NChannels());
    EXPECT_EQ(1, aImage.ChannelNames().size());
    EXPECT_EQ("A", aImage.ChannelNames()[0]);
    for (int y = 0; y < res.y; ++y)
        for (int x = 0; x < res.x; ++x)
            EXPECT_EQ(aImage.GetChannel({x, y}, 0), image.GetChannel({x, y}, 0));

    auto rgDesc = image.GetChannelDesc({"R", "G"});
    EXPECT_TRUE(bool(rgDesc));
    Image rgImage = image.SelectChannels(rgDesc);
    EXPECT_EQ(rgImage.Resolution(), image.Resolution());
    EXPECT_EQ(2, rgImage.NChannels());
    EXPECT_EQ(2, rgImage.ChannelNames().size());
    EXPECT_EQ("R", rgImage.ChannelNames()[0]);
    EXPECT_EQ("G", rgImage.ChannelNames()[1]);
    for (int y = 0; y < res.y; ++y)
        for (int x = 0; x < res.x; ++x) {
            EXPECT_EQ(rgImage.GetChannel({x, y}, 0), image.GetChannel({x, y}, 3));
            EXPECT_EQ(rgImage.GetChannel({x, y}, 1), image.GetChannel({x, y}, 2));
        }
}